

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_api_json_autogen.cpp
# Opt level: O2

ElementsDecodeRawTransactionTxOutStruct * __thiscall
cfd::api::json::ElementsDecodeRawTransactionTxOut::ConvertToStruct
          (ElementsDecodeRawTransactionTxOutStruct *__return_storage_ptr__,
          ElementsDecodeRawTransactionTxOut *this)

{
  int64_t iVar1;
  int iVar2;
  ElementsDecodeLockingScriptStruct EStack_168;
  
  ElementsDecodeRawTransactionTxOutStruct::ElementsDecodeRawTransactionTxOutStruct
            (__return_storage_ptr__);
  iVar1 = this->value_minimum_;
  __return_storage_ptr__->value = this->value_;
  __return_storage_ptr__->value_minimum = iVar1;
  __return_storage_ptr__->value_maximum = this->value_maximum_;
  iVar2 = this->ct_bits_;
  __return_storage_ptr__->ct_exponent = this->ct_exponent_;
  __return_storage_ptr__->ct_bits = iVar2;
  std::__cxx11::string::_M_assign((string *)&__return_storage_ptr__->surjectionproof);
  std::__cxx11::string::_M_assign((string *)&__return_storage_ptr__->valuecommitment);
  std::__cxx11::string::_M_assign((string *)&__return_storage_ptr__->asset);
  std::__cxx11::string::_M_assign((string *)&__return_storage_ptr__->assetcommitment);
  std::__cxx11::string::_M_assign((string *)&__return_storage_ptr__->commitmentnonce);
  __return_storage_ptr__->commitmentnonce_fully_valid = this->commitmentnonce_fully_valid_;
  __return_storage_ptr__->n = this->n_;
  ElementsDecodeLockingScript::ConvertToStruct(&EStack_168,&this->script_pub_key_);
  ElementsDecodeLockingScriptStruct::operator=(&__return_storage_ptr__->script_pub_key,&EStack_168);
  ElementsDecodeLockingScriptStruct::~ElementsDecodeLockingScriptStruct(&EStack_168);
  std::__cxx11::string::_M_assign((string *)&__return_storage_ptr__->rangeproof);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&(__return_storage_ptr__->ignore_items)._M_t,&(this->ignore_items)._M_t);
  return __return_storage_ptr__;
}

Assistant:

ElementsDecodeRawTransactionTxOutStruct ElementsDecodeRawTransactionTxOut::ConvertToStruct() const {  // NOLINT
  ElementsDecodeRawTransactionTxOutStruct result;
  result.value = value_;
  result.value_minimum = value_minimum_;
  result.value_maximum = value_maximum_;
  result.ct_exponent = ct_exponent_;
  result.ct_bits = ct_bits_;
  result.surjectionproof = surjectionproof_;
  result.valuecommitment = valuecommitment_;
  result.asset = asset_;
  result.assetcommitment = assetcommitment_;
  result.commitmentnonce = commitmentnonce_;
  result.commitmentnonce_fully_valid = commitmentnonce_fully_valid_;
  result.n = n_;
  result.script_pub_key = script_pub_key_.ConvertToStruct();
  result.rangeproof = rangeproof_;
  result.ignore_items = ignore_items;
  return result;
}